

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_samtools.c
# Opt level: O2

bam_hdr_t * cram_header_to_bam(SAM_hdr *h)

{
  bam_hdr_t *pbVar1;
  char *pcVar2;
  char **ppcVar3;
  uint32_t *puVar4;
  int iVar5;
  uint32_t uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  pbVar1 = bam_hdr_init();
  uVar7 = (h->text).l;
  uVar6 = (uint32_t)uVar7;
  pbVar1->l_text = uVar6;
  pcVar2 = (char *)malloc((ulong)(uVar6 + 1));
  pbVar1->text = pcVar2;
  uVar7 = uVar7 & 0xffffffff;
  memcpy(pcVar2,(h->text).s,uVar7);
  pcVar2[uVar7] = '\0';
  iVar5 = h->nref;
  pbVar1->n_targets = iVar5;
  ppcVar3 = (char **)calloc((long)iVar5,8);
  pbVar1->target_name = ppcVar3;
  puVar4 = (uint32_t *)calloc((long)iVar5,4);
  pbVar1->target_len = puVar4;
  lVar9 = 0;
  for (lVar8 = 0; lVar8 < iVar5; lVar8 = lVar8 + 1) {
    pcVar2 = strdup((&h->ref->name)[lVar9]);
    *(char **)((long)pbVar1->target_name + lVar9 * 2) = pcVar2;
    *(uint32_t *)((long)pbVar1->target_len + lVar9) = (&h->ref->len)[lVar9 * 2];
    iVar5 = h->nref;
    lVar9 = lVar9 + 4;
  }
  return pbVar1;
}

Assistant:

bam_hdr_t *cram_header_to_bam(SAM_hdr *h) {
    int i;
    bam_hdr_t *header = bam_hdr_init();

    header->l_text = ks_len(&h->text);
    header->text = malloc(header->l_text+1);
    memcpy(header->text, ks_str(&h->text), header->l_text);
    header->text[header->l_text] = 0;

    header->n_targets = h->nref;
    header->target_name = (char **)calloc(header->n_targets,
					  sizeof(char *));
    header->target_len = (uint32_t *)calloc(header->n_targets, 4);

    for (i = 0; i < h->nref; i++) {
	header->target_name[i] = strdup(h->ref[i].name);
	header->target_len[i] = h->ref[i].len;
    }

    return header;
}